

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void cmExtraEclipseCDT4Generator::AppendLinkedResource
               (cmXMLWriter *xml,string *name,string *path,LinkType linkType)

{
  char *pcVar1;
  allocator local_49;
  string local_48;
  int local_24;
  
  pcVar1 = "location";
  if (linkType == VirtualFolder) {
    pcVar1 = "locationURI";
  }
  local_24 = (linkType != LinkToFile) + 1;
  std::__cxx11::string::string((string *)&local_48,"link",&local_49);
  cmXMLWriter::StartElement(xml,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"name",&local_49);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_48,name);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"type",&local_49);
  cmXMLWriter::Element<int>(xml,&local_48,&local_24);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,pcVar1,&local_49);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_48,path);
  std::__cxx11::string::~string((string *)&local_48);
  cmXMLWriter::EndElement(xml);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::AppendLinkedResource(cmXMLWriter& xml,
                                                       const std::string& name,
                                                       const std::string& path,
                                                       LinkType linkType)
{
  const char* locationTag = "location";
  int typeTag = 2;
  if (linkType == VirtualFolder) // ... and not a linked folder
  {
    locationTag = "locationURI";
  }
  if (linkType == LinkToFile) {
    typeTag = 1;
  }

  xml.StartElement("link");
  xml.Element("name", name);
  xml.Element("type", typeTag);
  xml.Element(locationTag, path);
  xml.EndElement();
}